

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O0

int gost_grasshopper_cipher_ctl(EVP_CIPHER_CTX *ctx,int type,int arg,void *ptr)

{
  undefined4 uVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  char *pcVar5;
  long lVar6;
  char *in_RCX;
  gost_grasshopper_cipher_ctx *c_00;
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  uchar *unaff_retaddr;
  uchar *in_stack_00000008;
  gost_grasshopper_cipher_ctx_ctr *in_cctx;
  gost_grasshopper_cipher_ctx_ctr *out_cctx;
  EVP_CIPHER_CTX *out;
  gost_grasshopper_cipher_ctx_ctr *c_2;
  stack_st_X509_ATTRIBUTE *x;
  int adj_byte;
  int decrement_arg;
  int carry;
  int j;
  uchar seq [8];
  uchar adjusted_iv [16];
  gost_grasshopper_cipher_ctx *c_1;
  gost_grasshopper_cipher_ctx_ctr *ctr_ctx;
  int mode;
  uchar newkey [32];
  gost_grasshopper_cipher_ctx_ctr *c;
  uint8_t *in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  stack_st_X509_ATTRIBUTE *in_stack_ffffffffffffff58;
  uint local_88;
  int local_84;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_60;
  undefined8 local_58;
  int local_4c;
  char *local_20;
  int local_18;
  undefined8 local_10;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar7;
  
  iVar7 = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  c_00 = (gost_grasshopper_cipher_ctx *)(ulong)(in_ESI - 6U);
  local_18 = in_EDX;
  local_10 = in_RDI;
  switch(c_00) {
  case (gost_grasshopper_cipher_ctx *)0x0:
    uVar1 = EVP_CIPHER_CTX_get_key_length(in_RDI);
    iVar7 = RAND_priv_bytes(in_RCX,uVar1);
    if (iVar7 < 1) {
      ERR_GOST_error((int)((ulong)c_00 >> 0x20),(int)c_00,in_RCX,0);
      return -1;
    }
    goto LAB_0012dc67;
  default:
    ERR_GOST_error(0,in_ESI - 6U,(char *)in_stack_ffffffffffffff38,0);
    iVar7 = -1;
    break;
  case (gost_grasshopper_cipher_ctx *)0x2:
    lVar6 = EVP_CIPHER_CTX_get_cipher_data(in_RCX);
    pcVar5 = (char *)EVP_CIPHER_CTX_get_cipher_data(local_10);
    if (*pcVar5 == '\x06') {
      if (*(long *)(pcVar5 + 0x1c8) == *(long *)(lVar6 + 0x1c8)) {
        uVar3 = EVP_MD_CTX_new();
        *(undefined8 *)(lVar6 + 0x1c8) = uVar3;
        if (*(long *)(lVar6 + 0x1c8) == 0) {
          ERR_GOST_error((int)((ulong)c_00 >> 0x20),(int)c_00,(char *)in_stack_ffffffffffffff38,0);
          return -1;
        }
      }
      iVar7 = EVP_MD_CTX_copy(*(EVP_MD_CTX **)(lVar6 + 0x1c8),*(EVP_MD_CTX **)(pcVar5 + 0x1c8));
    }
    else {
      iVar7 = -1;
    }
    break;
  case (gost_grasshopper_cipher_ctx *)0x1a:
    pcVar5 = (char *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    if ((((*pcVar5 != '\x05') && (*pcVar5 != '\x06')) || (local_18 == 0)) || (local_18 % 0x10 != 0))
    {
      return -1;
    }
    *(int *)(pcVar5 + 0x1a8) = local_18;
LAB_0012dc67:
    iVar7 = 1;
    break;
  case (gost_grasshopper_cipher_ctx *)0x22:
    pcVar5 = (char *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    if (*pcVar5 == '\x06') {
      iVar7 = gost2015_process_unprotected_attributes
                        (in_stack_ffffffffffffff58,iVar7,in_stack_ffffffffffffff48,&c_00->type);
    }
    else {
      iVar7 = -1;
    }
    break;
  case (gost_grasshopper_cipher_ctx *)0x24:
    local_20 = in_RCX;
    uVar3 = EVP_CIPHER_CTX_get0_cipher(in_RDI);
    local_4c = EVP_CIPHER_get_mode(uVar3);
    local_58 = 0;
    local_60 = 0;
    if (local_4c == 5) {
      local_60 = EVP_CIPHER_CTX_get_cipher_data(local_10);
      local_80 = *(undefined8 *)local_20;
      local_58 = local_60;
      iVar7 = decrement_sequence((uchar *)&local_80,local_18);
      if (iVar7 == 0) {
        ERR_GOST_error((int)((ulong)c_00 >> 0x20),(int)c_00,(char *)in_stack_ffffffffffffff38,0);
        iVar7 = -1;
      }
      else {
        iVar7 = gost_tlstree((int)in_cctx,in_stack_00000008,unaff_retaddr,
                             (uchar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
        ;
        if (iVar7 < 1) {
          iVar7 = -1;
        }
        else {
          memset(&local_78,0,0x10);
          puVar4 = (undefined8 *)EVP_CIPHER_CTX_original_iv(local_10);
          local_78 = *puVar4;
          local_88 = 0;
          for (local_84 = 7; -1 < local_84; local_84 = local_84 + -1) {
            uVar2 = (uint)*(byte *)((long)&local_78 + (long)local_84) +
                    (uint)*(byte *)((long)&local_80 + (long)local_84) + local_88;
            local_88 = (uint)(0xff < uVar2);
            *(char *)((long)&local_78 + (long)local_84) = (char)uVar2;
          }
          EVP_CIPHER_CTX_set_num(local_10,0);
          puVar4 = (undefined8 *)EVP_CIPHER_CTX_iv_noconst(local_10);
          *puVar4 = local_78;
          puVar4[1] = local_70;
          gost_grasshopper_cipher_key(c_00,in_stack_ffffffffffffff38);
          iVar7 = 1;
        }
      }
    }
    else {
      iVar7 = -1;
    }
  }
  return iVar7;
}

Assistant:

static int gost_grasshopper_cipher_ctl(EVP_CIPHER_CTX *ctx, int type, int arg, void *ptr)
{
    switch (type) {
    case EVP_CTRL_RAND_KEY:{
            if (RAND_priv_bytes
                ((unsigned char *)ptr, EVP_CIPHER_CTX_key_length(ctx)) <= 0) {
                GOSTerr(GOST_F_GOST_GRASSHOPPER_CIPHER_CTL, GOST_R_RNG_ERROR);
                return -1;
            }
            break;
        }
    case EVP_CTRL_KEY_MESH:{
            gost_grasshopper_cipher_ctx_ctr *c =
                EVP_CIPHER_CTX_get_cipher_data(ctx);
            if ((c->c.type != GRASSHOPPER_CIPHER_CTRACPKM &&
                c->c.type != GRASSHOPPER_CIPHER_CTRACPKMOMAC)
                || (arg == 0)
               || (arg % GRASSHOPPER_BLOCK_SIZE))
                return -1;
            c->section_size = arg;
            break;
        }
    case EVP_CTRL_TLSTREE:
        {
          unsigned char newkey[32];
          int mode = EVP_CIPHER_CTX_mode(ctx);
          gost_grasshopper_cipher_ctx_ctr *ctr_ctx = NULL;
          gost_grasshopper_cipher_ctx *c = NULL;

          unsigned char adjusted_iv[16];
          unsigned char seq[8];
          int j, carry, decrement_arg;
          if (mode != EVP_CIPH_CTR_MODE)
              return -1;

          ctr_ctx = (gost_grasshopper_cipher_ctx_ctr *)
              EVP_CIPHER_CTX_get_cipher_data(ctx);
          c = &(ctr_ctx->c);

          /*
           * 'arg' parameter indicates what we should do with sequence value.
           * 
           * When function called, seq is incremented after MAC calculation.
           * In ETM mode, we use seq 'as is' in the ctrl-function (arg = 0)
           * Otherwise we have to decrease it in the implementation (arg = 1).
           */
          memcpy(seq, ptr, 8);
          decrement_arg = arg;
          if (!decrement_sequence(seq, decrement_arg))
          {
              GOSTerr(GOST_F_GOST_GRASSHOPPER_CIPHER_CTL, GOST_R_CTRL_CALL_FAILED);
              return -1;
          }

          if (gost_tlstree(NID_grasshopper_cbc, c->master_key.k.b, newkey,
                (const unsigned char *)seq) > 0) {
            memset(adjusted_iv, 0, 16);
            memcpy(adjusted_iv, EVP_CIPHER_CTX_original_iv(ctx), 8);
            for(j=7,carry=0; j>=0; j--)
            {
              int adj_byte = adjusted_iv[j]+seq[j]+carry;
              carry = (adj_byte > 255) ? 1 : 0;
              adjusted_iv[j] = adj_byte & 0xFF;
            }
            EVP_CIPHER_CTX_set_num(ctx, 0);
            memcpy(EVP_CIPHER_CTX_iv_noconst(ctx), adjusted_iv, 16);

            gost_grasshopper_cipher_key(c, newkey);
            return 1;
          }
        }
        return -1;
#if 0
    case EVP_CTRL_AEAD_GET_TAG:
    case EVP_CTRL_AEAD_SET_TAG:
        {
            int taglen = arg;
            unsigned char *tag = ptr;

            gost_grasshopper_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
            if (c->c.type != GRASSHOPPER_CIPHER_MGM)
                return -1;

            if (taglen > KUZNYECHIK_MAC_MAX_SIZE) {
                CRYPTOCOMerr(CRYPTOCOM_F_GOST_GRASSHOPPER_CIPHER_CTL,
                        CRYPTOCOM_R_INVALID_TAG_LENGTH);
                return -1;
            }

            if (type == EVP_CTRL_AEAD_GET_TAG)
                memcpy(tag, c->final_tag, taglen);
            else
                memcpy(c->final_tag, tag, taglen);

            return 1;
        }
#endif
    case EVP_CTRL_PROCESS_UNPROTECTED:
    {
      STACK_OF(X509_ATTRIBUTE) *x = ptr;
      gost_grasshopper_cipher_ctx_ctr *c = EVP_CIPHER_CTX_get_cipher_data(ctx);

      if (c->c.type != GRASSHOPPER_CIPHER_CTRACPKMOMAC)
        return -1;

      return gost2015_process_unprotected_attributes(x, arg, KUZNYECHIK_MAC_MAX_SIZE, c->tag);
    }
    case EVP_CTRL_COPY: {
        EVP_CIPHER_CTX *out = ptr;

        gost_grasshopper_cipher_ctx_ctr *out_cctx = EVP_CIPHER_CTX_get_cipher_data(out);
        gost_grasshopper_cipher_ctx_ctr *in_cctx  = EVP_CIPHER_CTX_get_cipher_data(ctx);

        if (in_cctx->c.type != GRASSHOPPER_CIPHER_CTRACPKMOMAC)
            return -1;

        if (in_cctx->omac_ctx == out_cctx->omac_ctx) {
            out_cctx->omac_ctx = EVP_MD_CTX_new();
            if (out_cctx->omac_ctx == NULL) {
                GOSTerr(GOST_F_GOST_GRASSHOPPER_CIPHER_CTL, ERR_R_MALLOC_FAILURE);
                return -1;
            }
        }
        return EVP_MD_CTX_copy(out_cctx->omac_ctx, in_cctx->omac_ctx);
    }
    default:
        GOSTerr(GOST_F_GOST_GRASSHOPPER_CIPHER_CTL,
                GOST_R_UNSUPPORTED_CIPHER_CTL_COMMAND);
        return -1;
    }
    return 1;
}